

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::LoadBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::LoadBean>>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av)

{
  bool bVar1;
  database_error *this_00;
  pair<hiberlite::SQLiteSelect,_long_long> local_300;
  undefined1 local_2c1;
  Scope local_2c0;
  Scope local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  string local_1d8 [32];
  undefined1 local_1b8 [24];
  SQLiteSelect sel;
  Scope local_148;
  undefined1 local_100 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string query;
  sqlid_t local_20;
  sqlid_t curId;
  AVisitor<hiberlite::LoadBean> *av_local;
  LoadBean *this_local;
  
  curId = (sqlid_t)av;
  av_local = (AVisitor<hiberlite::LoadBean> *)this;
  while( true ) {
    bVar1 = std::
            stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
            ::empty(&this->stmt);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
    ::pop(&this->stmt);
  }
  local_20 = AVisitor<hiberlite::LoadBean>::getRootId((AVisitor<hiberlite::LoadBean> *)curId);
  AVisitor<hiberlite::LoadBean>::getScope(&local_148,(AVisitor<hiberlite::LoadBean> *)curId);
  Scope::table_abi_cxx11_((Scope *)local_100);
  std::operator+(local_100 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "SELECT * FROM ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_100 + 0x40),local_100 + 0x20);
  std::operator+(local_a0,local_100 + 0x40);
  std::operator+(local_80,(char *)local_a0);
  Transformer::toSQLiteValue_abi_cxx11_((Transformer *)&sel.con.res,&local_20);
  std::operator+(local_60,local_80);
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&sel.con.res);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(local_100 + 0x40));
  std::__cxx11::string::~string((string *)(local_100 + 0x20));
  std::__cxx11::string::~string((string *)local_100);
  Scope::~Scope(&local_148);
  AVisitor<hiberlite::LoadBean>::getConnection((AVisitor<hiberlite::LoadBean> *)local_1b8);
  std::__cxx11::string::string(local_1d8,(string *)local_40);
  SQLiteSelect::SQLiteSelect
            ((SQLiteSelect *)(local_1b8 + 0x10),(shared_connection *)local_1b8,(string *)local_1d8);
  std::__cxx11::string::~string(local_1d8);
  shared_res<hiberlite::autoclosed_con>::~shared_res
            ((shared_res<hiberlite::autoclosed_con> *)local_1b8);
  bVar1 = SQLiteSelect::step((SQLiteSelect *)(local_1b8 + 0x10));
  if (!bVar1) {
    local_2c1 = 1;
    this_00 = (database_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((__cxx11 *)&local_278._prefix,local_20);
    std::operator+((char *)&local_278.prefix_depth,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Id ");
    std::operator+(local_218,(char *)&local_278.prefix_depth);
    AVisitor<hiberlite::LoadBean>::getScope(&local_2c0,(AVisitor<hiberlite::LoadBean> *)curId);
    Scope::table_abi_cxx11_(&local_278);
    std::operator+(local_1f8,local_218);
    database_error::database_error(this_00,local_1f8);
    local_2c1 = 0;
    __cxa_throw(this_00,&database_error::typeinfo,database_error::~database_error);
  }
  std::make_pair<hiberlite::SQLiteSelect&,long_long&>
            (&local_300,(SQLiteSelect *)(local_1b8 + 0x10),&local_20);
  std::
  stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
  ::push(&this->stmt,&local_300);
  std::pair<hiberlite::SQLiteSelect,_long_long>::~pair(&local_300);
  SQLiteSelect::~SQLiteSelect((SQLiteSelect *)(local_1b8 + 0x10));
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void LoadBean::notifyInitWalk(AV& av)
{
	while(!stmt.empty())
		stmt.pop();

	sqlid_t curId=av.getRootId();

	std::string query="SELECT * FROM "+av.getScope().table()
						+" WHERE "+HIBERLITE_PRIMARY_KEY_COLUMN+"="+Transformer::toSQLiteValue(curId)+";";

	SQLiteSelect sel(av.getConnection(), query);
	if(!sel.step())
		throw database_error("Id " + std::to_string(curId) + " not found in table " + av.getScope().table());
	stmt.push( std::make_pair(sel,curId) );
}